

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O3

typed_option<std::vector<int,_std::allocator<int>_>_> * __thiscall
VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>::value
          (typed_option<std::vector<int,_std::allocator<int>_>_> *this,
          vector<int,_std::allocator<int>_> *value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  vector<int,_std::allocator<int>_> *pvVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_29;
  vector<int,_std::allocator<int>_> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>,std::vector<int,std::allocator<int>>&>
            (a_Stack_20,&local_28,(allocator<std::vector<int,_std::allocator<int>_>_> *)&local_29,
             value);
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  pvVar1 = local_28;
  local_28 = (vector<int,_std::allocator<int>_> *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_value).
            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_value).
  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pvVar1;
  (this->m_value).
  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  return this;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }